

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinSerializer<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_void>
     ::serialize_elems<binlog::detail::QueueWriter>
               (undefined8 param_1,undefined4 param_2,undefined8 param_3)

{
  bool bVar1;
  reference in;
  pair<const_int,_int> *elem;
  const_iterator __end0;
  const_iterator __begin0;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range3;
  QueueWriter *in_stack_ffffffffffffffb8;
  _Self local_38;
  _Self local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  
  local_28 = param_1;
  local_20 = param_3;
  local_14 = param_2;
  local_10 = param_1;
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                 ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  in_stack_ffffffffffffffb8);
  local_38._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                 ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    in = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator*
                   ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)0x23bf69);
    serialize<std::pair<int_const,int>,binlog::detail::QueueWriter>(in,in_stack_ffffffffffffffb8);
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)in);
  }
  return;
}

Assistant:

static void serialize_elems(
    std::false_type /* no batch copy */,
    const Sequence& s, std::uint32_t /* size */, OutputStream& ostream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::serialize<value_type>(elem, ostream);
    }
  }